

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QFileInfo>_>::erase
          (QMovableArrayOps<std::pair<QString,_QFileInfo>_> *this,pair<QString,_QFileInfo> *b,
          qsizetype n)

{
  pair<QString,_QFileInfo> *__src;
  pair<QString,_QFileInfo> *ppVar1;
  long in_RDX;
  pair<QString,_QFileInfo> *in_RSI;
  long in_RDI;
  pair<QString,_QFileInfo> *e;
  pair<QString,_QFileInfo> *in_stack_ffffffffffffffa8;
  pair<QString,_QFileInfo> *in_stack_ffffffffffffffb0;
  
  __src = in_RSI + in_RDX;
  std::destroy<std::pair<QString,QFileInfo>*>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ppVar1 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::begin
                     ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa9e84a);
  if ((in_RSI == ppVar1) &&
     (ppVar1 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::end
                         ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
                          in_stack_ffffffffffffffb0), __src != ppVar1)) {
    *(pair<QString,_QFileInfo> **)(in_RDI + 8) = __src;
  }
  else {
    ppVar1 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::end
                       ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
                        in_stack_ffffffffffffffb0);
    if (__src != ppVar1) {
      ppVar1 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::end
                         ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)in_RSI);
      memmove(in_RSI,__src,((long)ppVar1 - (long)__src >> 5) << 5);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }